

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.c
# Opt level: O3

void export_results(double **results,uint total_experiments)

{
  char *result_to_string_00;
  tm *__tp;
  time_t timer;
  char time_representation [64];
  char filename [64];
  char result_to_string [131072];
  time_t tStack_200b0;
  char acStack_200a8 [64];
  char acStack_20068 [64];
  char acStack_20028 [131072];
  
  result_to_string_00 = acStack_200a8 + 0x80;
  memset(result_to_string_00,0,0x20000);
  tStack_200b0 = time((time_t *)0x0);
  __tp = localtime(&tStack_200b0);
  strftime(acStack_200a8,0x40,"%G_%b_%d_%H-%M-%S",__tp);
  export_results_to_string(results,total_experiments,result_to_string_00);
  mkdir("results",0x1c0);
  snprintf(acStack_200a8 + 0x40,0x40,"results/%s_results.csv",acStack_200a8);
  rewrite_file(acStack_200a8 + 0x40,result_to_string_00);
  return;
}

Assistant:

void export_results (double *const * results, unsigned total_experiments) {
  char filename[MAX_FILENAME_SIZE] = "";
  char time_representation[MAX_FILENAME_SIZE] = "";
  char result_to_string[MAX_BUFFER_SIZE] = "";

  struct tm * time_info;
  time_t timer = time(NULL);

  time_info = localtime (&timer);
  strftime (time_representation, MAX_FILENAME_SIZE, "%G_%b_%d_%H-%M-%S", time_info);

  export_results_to_string (results, total_experiments, result_to_string);
  // might be cross-platform issues
  mkdir ("results", S_IRWXU);
  snprintf (filename, MAX_FILENAME_SIZE, "results/%s_results.csv", time_representation);

  rewrite_file (filename, result_to_string);

#ifdef ALTERNATIVE_OUTPUT
  printf(FANCY_INFO "Results saved to file `%s'.\n", filename);
#endif /* ALTERNATIVE_OUTPUT */

  return;
}